

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall
ThreadPool<std::packaged_task<void_()>_>::~ThreadPool
          (ThreadPool<std::packaged_task<void_()>_> *this)

{
  pointer ptVar1;
  pointer ptVar2;
  
  LOCK();
  (this->is_working)._M_base._M_i = false;
  UNLOCK();
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  std::condition_variable::~condition_variable(&(this->queue).cond_var_push);
  std::condition_variable::~condition_variable(&(this->queue).cond_var_pop);
  std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::~deque
            ((deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_> *)
             this);
  return;
}

Assistant:

ThreadPool<T>::~ThreadPool() {
    is_working = false;
    for (auto& thread : threads) {
        thread.join();
    }
}